

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktGeometryBasicGeometryShaderTests.cpp
# Opt level: O2

void __thiscall
vkt::geometry::anon_unknown_0::BuiltinVariableRenderTest::initPrograms
          (BuiltinVariableRenderTest *this,SourceCollections *sourceCollections)

{
  VariableTest VVar1;
  char *pcVar2;
  ostream *poVar3;
  ProgramSources *pPVar4;
  allocator<char> local_1f9;
  string local_1f8;
  string local_1d8;
  undefined1 local_1b8 [40];
  ostringstream src;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&src);
  pcVar2 = glu::getGLSLVersionDeclaration(GLSL_VERSION_450);
  poVar3 = std::operator<<((ostream *)&src,pcVar2);
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"out gl_PerVertex\n");
  poVar3 = std::operator<<(poVar3," {\n");
  poVar3 = std::operator<<(poVar3,"\tvec4 gl_Position;\n");
  poVar3 = std::operator<<(poVar3,"\tfloat gl_PointSize;\n");
  poVar3 = std::operator<<(poVar3,"};\n");
  std::operator<<(poVar3,"layout(location = 0) in vec4 a_position;\n");
  VVar1 = this->m_test;
  if (VVar1 == TEST_POINT_SIZE) {
    poVar3 = std::operator<<((ostream *)&src,"layout(location = 1) in vec4 a_pointSize;\n");
    poVar3 = std::operator<<(poVar3,"layout(location = 0) out vec4 v_geom_pointSize;\n");
    poVar3 = std::operator<<(poVar3,"void main (void)\n");
    poVar3 = std::operator<<(poVar3,"{\n");
    poVar3 = std::operator<<(poVar3,"\tgl_Position = a_position;\n");
    poVar3 = std::operator<<(poVar3,"\tgl_PointSize = 1.0;\n");
    pcVar2 = "\tv_geom_pointSize = a_pointSize;\n";
LAB_0088058b:
    poVar3 = std::operator<<(poVar3,pcVar2);
    std::operator<<(poVar3,"}\n");
  }
  else {
    if (VVar1 == TEST_PRIMITIVE_ID_IN) {
      poVar3 = std::operator<<((ostream *)&src,"void main (void)\n");
      poVar3 = std::operator<<(poVar3,"{\n");
      pcVar2 = "\tgl_Position = a_position;\n";
      goto LAB_0088058b;
    }
    if (VVar1 == TEST_PRIMITIVE_ID) {
      poVar3 = std::operator<<((ostream *)&src,"layout(location = 1) in vec4 a_primitiveID;\n");
      poVar3 = std::operator<<(poVar3,"layout(location = 0) out vec4 v_geom_primitiveID;\n");
      poVar3 = std::operator<<(poVar3,"void main (void)\n");
      poVar3 = std::operator<<(poVar3,"{\n");
      poVar3 = std::operator<<(poVar3,"\tgl_Position = a_position;\n");
      pcVar2 = "\tv_geom_primitiveID = a_primitiveID;\n";
      goto LAB_0088058b;
    }
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"vertex",&local_1f9);
  pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&sourceCollections->glslSources,&local_1d8);
  std::__cxx11::stringbuf::str();
  glu::VertexSource::VertexSource((VertexSource *)local_1b8,&local_1f8);
  glu::ProgramSources::operator<<(pPVar4,(ShaderSource *)local_1b8);
  std::__cxx11::string::~string((string *)(local_1b8 + 8));
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&src);
  pcVar2 = glu::getGLSLVersionDeclaration(GLSL_VERSION_450);
  poVar3 = std::operator<<((ostream *)&src,pcVar2);
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"in gl_PerVertex\n");
  poVar3 = std::operator<<(poVar3,"{\n");
  poVar3 = std::operator<<(poVar3,"\tvec4 gl_Position;\n");
  poVar3 = std::operator<<(poVar3,"\tfloat gl_PointSize;\n");
  poVar3 = std::operator<<(poVar3,"} gl_in[];\n");
  poVar3 = std::operator<<(poVar3,"out gl_PerVertex\n");
  poVar3 = std::operator<<(poVar3,"{\n");
  poVar3 = std::operator<<(poVar3,"\tvec4 gl_Position;\n");
  poVar3 = std::operator<<(poVar3,"\tfloat gl_PointSize;\n");
  std::operator<<(poVar3,"};\n");
  VVar1 = this->m_test;
  if (VVar1 == TEST_POINT_SIZE) {
    poVar3 = std::operator<<((ostream *)&src,"#extension GL_EXT_geometry_point_size : require\n");
    poVar3 = std::operator<<(poVar3,"layout(points) in;\n");
    poVar3 = std::operator<<(poVar3,"layout(points, max_vertices = 1) out;\n");
    poVar3 = std::operator<<(poVar3,"layout(location = 0) in vec4 v_geom_pointSize[];\n");
    poVar3 = std::operator<<(poVar3,"layout(location = 0) out vec4 v_frag_FragColor;\n");
    poVar3 = std::operator<<(poVar3,"void main (void)\n");
    poVar3 = std::operator<<(poVar3,"{\n");
    poVar3 = std::operator<<(poVar3,"\tgl_Position = gl_in[0].gl_Position;\n");
    poVar3 = std::operator<<(poVar3,"\tgl_PointSize = v_geom_pointSize[0].x + 1.0;\n");
    pcVar2 = "\tv_frag_FragColor = vec4(1.0, 1.0, 1.0, 1.0);\n";
LAB_0088095b:
    poVar3 = std::operator<<(poVar3,pcVar2);
    pcVar2 = "\tEmitVertex();\n";
LAB_0088096d:
    poVar3 = std::operator<<(poVar3,pcVar2);
    std::operator<<(poVar3,"}\n");
  }
  else {
    if (VVar1 == TEST_PRIMITIVE_ID_IN) {
      poVar3 = std::operator<<((ostream *)&src,"layout(lines) in;\n");
      poVar3 = std::operator<<(poVar3,"layout(triangle_strip, max_vertices = 10) out;\n");
      poVar3 = std::operator<<(poVar3,"layout(location = 0) out vec4 v_frag_FragColor;\n");
      poVar3 = std::operator<<(poVar3,"void main (void)\n");
      poVar3 = std::operator<<(poVar3,"{\n");
      poVar3 = std::operator<<(poVar3,"\tconst vec4 red = vec4(1.0, 0.0, 0.0, 1.0);\n");
      poVar3 = std::operator<<(poVar3,"\tconst vec4 green = vec4(0.0, 1.0, 0.0, 1.0);\n");
      poVar3 = std::operator<<(poVar3,"\tconst vec4 blue = vec4(0.0, 0.0, 1.0, 1.0);\n");
      poVar3 = std::operator<<(poVar3,"\tconst vec4 yellow = vec4(1.0, 1.0, 0.0, 1.0);\n");
      poVar3 = std::operator<<(poVar3,
                               "\tconst vec4 colors[4] = vec4[4](red, green, blue, yellow);\n");
      poVar3 = std::operator<<(poVar3,
                               "\tfor (float percent=0.00; percent < 0.30; percent+=0.10)\n{\n");
      poVar3 = std::operator<<(poVar3,
                               "\t\tgl_Position = gl_in[0].gl_Position * vec4(1.0+percent, 1.0+percent, 1.0, 1.0);\n"
                              );
      poVar3 = std::operator<<(poVar3,"\t\tv_frag_FragColor = colors[gl_PrimitiveIDIn % 4];\n");
      poVar3 = std::operator<<(poVar3,"\t\tEmitVertex();\n");
      poVar3 = std::operator<<(poVar3,
                               "\t\tgl_Position = gl_in[1].gl_Position * vec4(1.0+percent, 1.0+percent, 1.0, 1.0);\n"
                              );
      poVar3 = std::operator<<(poVar3,"\t\tv_frag_FragColor = colors[gl_PrimitiveIDIn % 4];\n");
      poVar3 = std::operator<<(poVar3,"\t\tEmitVertex();\n");
      pcVar2 = "\t}\n";
      goto LAB_0088096d;
    }
    if (VVar1 == TEST_PRIMITIVE_ID) {
      poVar3 = std::operator<<((ostream *)&src,"layout(points, invocations=1) in;\n");
      poVar3 = std::operator<<(poVar3,"layout(triangle_strip, max_vertices = 3) out;\n");
      poVar3 = std::operator<<(poVar3,"layout(location = 0) in vec4 v_geom_primitiveID[];\n");
      poVar3 = std::operator<<(poVar3,"void main (void)\n");
      poVar3 = std::operator<<(poVar3,"{\n");
      poVar3 = std::operator<<(poVar3,
                               "\tgl_Position = gl_in[0].gl_Position + vec4(0.05, 0.0, 0.0, 0.0);\n"
                              );
      poVar3 = std::operator<<(poVar3,
                               "\tgl_PrimitiveID = int(floor(v_geom_primitiveID[0].x)) + 3;\n");
      poVar3 = std::operator<<(poVar3,"\tEmitVertex();\n");
      poVar3 = std::operator<<(poVar3,
                               "\tgl_Position = gl_in[0].gl_Position - vec4(0.05, 0.0, 0.0, 0.0);\n"
                              );
      pcVar2 = "\tgl_PrimitiveID = int(floor(v_geom_primitiveID[0].x)) + 3;\n";
      poVar3 = std::operator<<(poVar3,
                               "\tgl_PrimitiveID = int(floor(v_geom_primitiveID[0].x)) + 3;\n");
      poVar3 = std::operator<<(poVar3,"\tEmitVertex();\n");
      poVar3 = std::operator<<(poVar3,
                               "\tgl_Position = gl_in[0].gl_Position + vec4(0.0, 0.05, 0.0, 0.0);\n"
                              );
      goto LAB_0088095b;
    }
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"geometry",&local_1f9);
  pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&sourceCollections->glslSources,&local_1d8);
  std::__cxx11::stringbuf::str();
  glu::GeometrySource::GeometrySource((GeometrySource *)local_1b8,&local_1f8);
  glu::ProgramSources::operator<<(pPVar4,(ShaderSource *)local_1b8);
  std::__cxx11::string::~string((string *)(local_1b8 + 8));
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&src);
  pcVar2 = glu::getGLSLVersionDeclaration(GLSL_VERSION_450);
  poVar3 = std::operator<<((ostream *)&src,pcVar2);
  std::operator<<(poVar3,"\n");
  if (this->m_test < TEST_PRIMITIVE_ID) {
    poVar3 = std::operator<<((ostream *)&src,"layout(location = 0) out vec4 fragColor;\n");
    poVar3 = std::operator<<(poVar3,"layout(location = 0) in vec4 v_frag_FragColor;\n");
    poVar3 = std::operator<<(poVar3,"void main (void)\n");
    poVar3 = std::operator<<(poVar3,"{\n");
    pcVar2 = "\tfragColor = v_frag_FragColor;\n";
  }
  else {
    if (this->m_test != TEST_PRIMITIVE_ID) goto LAB_00880b1d;
    poVar3 = std::operator<<((ostream *)&src,"layout(location = 0) out vec4 fragColor;\n");
    poVar3 = std::operator<<(poVar3,"void main (void)\n");
    poVar3 = std::operator<<(poVar3,"{\n");
    poVar3 = std::operator<<(poVar3,"\tconst vec4 red\t\t\t= vec4(1.0, 0.0, 0.0, 1.0);\n");
    poVar3 = std::operator<<(poVar3,"\tconst vec4 green\t\t= vec4(0.0, 1.0, 0.0, 1.0);\n");
    poVar3 = std::operator<<(poVar3,"\tconst vec4 blue\t\t\t= vec4(0.0, 0.0, 1.0, 1.0);\n");
    poVar3 = std::operator<<(poVar3,"\tconst vec4 yellow\t\t= vec4(1.0, 1.0, 0.0, 1.0);\n");
    poVar3 = std::operator<<(poVar3,"\tconst vec4 colors[4]\t= vec4[4](yellow, red, green, blue);\n"
                            );
    pcVar2 = "\tfragColor = colors[gl_PrimitiveID % 4];\n";
  }
  poVar3 = std::operator<<(poVar3,pcVar2);
  std::operator<<(poVar3,"}\n");
LAB_00880b1d:
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"fragment",&local_1f9);
  pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&sourceCollections->glslSources,&local_1d8);
  std::__cxx11::stringbuf::str();
  glu::FragmentSource::FragmentSource((FragmentSource *)local_1b8,&local_1f8);
  glu::ProgramSources::operator<<(pPVar4,(ShaderSource *)local_1b8);
  std::__cxx11::string::~string((string *)(local_1b8 + 8));
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src);
  return;
}

Assistant:

void BuiltinVariableRenderTest::initPrograms (SourceCollections& sourceCollections) const
{
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_450) << "\n"
			<< "out gl_PerVertex\n"
			<<" {\n"
			<< "	vec4 gl_Position;\n"
			<< "	float gl_PointSize;\n"
			<< "};\n"
			<< "layout(location = 0) in vec4 a_position;\n";
		switch(m_test)
		{
			case TEST_POINT_SIZE:
				src	<< "layout(location = 1) in vec4 a_pointSize;\n"
					<< "layout(location = 0) out vec4 v_geom_pointSize;\n"
					<< "void main (void)\n"
					<< "{\n"
					<< "	gl_Position = a_position;\n"
					<< "	gl_PointSize = 1.0;\n"
					<< "	v_geom_pointSize = a_pointSize;\n"
					<< "}\n";
				break;
			case TEST_PRIMITIVE_ID_IN:
				src	<< "void main (void)\n"
					<< "{\n"
					<< "	gl_Position = a_position;\n"
					<< "}\n";
				break;
			case TEST_PRIMITIVE_ID:
				src	<< "layout(location = 1) in vec4 a_primitiveID;\n"
					<< "layout(location = 0) out vec4 v_geom_primitiveID;\n"
					<< "void main (void)\n"
					<< "{\n"
					<< "	gl_Position = a_position;\n"
					<< "	v_geom_primitiveID = a_primitiveID;\n"
					<< "}\n";
				break;
			default:
				DE_ASSERT(0);
				break;
		}
		sourceCollections.glslSources.add("vertex") << glu::VertexSource(src.str());
	}

	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_450) << "\n"
			<< "in gl_PerVertex\n"
			<<"{\n"
			<< "	vec4 gl_Position;\n"
			<< "	float gl_PointSize;\n"
			<< "} gl_in[];\n"
			<< "out gl_PerVertex\n"
			<<"{\n"
			<< "	vec4 gl_Position;\n"
			<< "	float gl_PointSize;\n"
			<< "};\n";
		switch(m_test)
		{
			case TEST_POINT_SIZE:
				src	<< "#extension GL_EXT_geometry_point_size : require\n"
					<< "layout(points) in;\n"
					<< "layout(points, max_vertices = 1) out;\n"
					<< "layout(location = 0) in vec4 v_geom_pointSize[];\n"
					<< "layout(location = 0) out vec4 v_frag_FragColor;\n"
					<< "void main (void)\n"
					<< "{\n"
					<< "	gl_Position = gl_in[0].gl_Position;\n"
					<< "	gl_PointSize = v_geom_pointSize[0].x + 1.0;\n"
					<< "	v_frag_FragColor = vec4(1.0, 1.0, 1.0, 1.0);\n"
					<< "	EmitVertex();\n"
					<< "}\n";
				break;
			case TEST_PRIMITIVE_ID_IN:
				src	<< "layout(lines) in;\n"
					<< "layout(triangle_strip, max_vertices = 10) out;\n"
					<< "layout(location = 0) out vec4 v_frag_FragColor;\n"
					<< "void main (void)\n"
					<< "{\n"
					<< "	const vec4 red = vec4(1.0, 0.0, 0.0, 1.0);\n"
					<< "	const vec4 green = vec4(0.0, 1.0, 0.0, 1.0);\n"
					<< "	const vec4 blue = vec4(0.0, 0.0, 1.0, 1.0);\n"
					<< "	const vec4 yellow = vec4(1.0, 1.0, 0.0, 1.0);\n"
					<< "	const vec4 colors[4] = vec4[4](red, green, blue, yellow);\n"
					<< "	for (float percent=0.00; percent < 0.30; percent+=0.10)\n"
							"{\n"
					<< "		gl_Position = gl_in[0].gl_Position * vec4(1.0+percent, 1.0+percent, 1.0, 1.0);\n"
					<< "		v_frag_FragColor = colors[gl_PrimitiveIDIn % 4];\n"
					<< "		EmitVertex();\n"
					<< "		gl_Position = gl_in[1].gl_Position * vec4(1.0+percent, 1.0+percent, 1.0, 1.0);\n"
					<< "		v_frag_FragColor = colors[gl_PrimitiveIDIn % 4];\n"
					<< "		EmitVertex();\n"
					<< "	}\n"
					<< "}\n";
				break;
			case TEST_PRIMITIVE_ID:
				src	<< "layout(points, invocations=1) in;\n"
					<< "layout(triangle_strip, max_vertices = 3) out;\n"
					<< "layout(location = 0) in vec4 v_geom_primitiveID[];\n"
					<< "void main (void)\n"
					<< "{\n"
					<< "	gl_Position = gl_in[0].gl_Position + vec4(0.05, 0.0, 0.0, 0.0);\n"
					<< "	gl_PrimitiveID = int(floor(v_geom_primitiveID[0].x)) + 3;\n"
					<< "	EmitVertex();\n"
					<< "	gl_Position = gl_in[0].gl_Position - vec4(0.05, 0.0, 0.0, 0.0);\n"
					<< "	gl_PrimitiveID = int(floor(v_geom_primitiveID[0].x)) + 3;\n"
					<< "	EmitVertex();\n"
					<< "	gl_Position = gl_in[0].gl_Position + vec4(0.0, 0.05, 0.0, 0.0);\n"
					<< "	gl_PrimitiveID = int(floor(v_geom_primitiveID[0].x)) + 3;\n"
					<< "	EmitVertex();\n"
					<< "}\n";
				break;
			default:
				DE_ASSERT(0);
				break;
		}
		sourceCollections.glslSources.add("geometry") << glu::GeometrySource(src.str());
	}

	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_450) << "\n";
		switch(m_test)
		{
			case TEST_POINT_SIZE:
				src	<< "layout(location = 0) out vec4 fragColor;\n"
					<< "layout(location = 0) in vec4 v_frag_FragColor;\n"
					<< "void main (void)\n"
					<< "{\n"
					<< "	fragColor = v_frag_FragColor;\n"
					<< "}\n";
				break;
			case TEST_PRIMITIVE_ID_IN:
				src	<< "layout(location = 0) out vec4 fragColor;\n"
					<< "layout(location = 0) in vec4 v_frag_FragColor;\n"
					<< "void main (void)\n"
					<< "{\n"
					<< "	fragColor = v_frag_FragColor;\n"
					<< "}\n";
				break;
			case TEST_PRIMITIVE_ID:
				src	<< "layout(location = 0) out vec4 fragColor;\n"
					<< "void main (void)\n"
					<< "{\n"
					<< "	const vec4 red			= vec4(1.0, 0.0, 0.0, 1.0);\n"
					<< "	const vec4 green		= vec4(0.0, 1.0, 0.0, 1.0);\n"
					<< "	const vec4 blue			= vec4(0.0, 0.0, 1.0, 1.0);\n"
					<< "	const vec4 yellow		= vec4(1.0, 1.0, 0.0, 1.0);\n"
					<< "	const vec4 colors[4]	= vec4[4](yellow, red, green, blue);\n"
					<< "	fragColor = colors[gl_PrimitiveID % 4];\n"
					<< "}\n";
				break;
			default:
				DE_ASSERT(0);
				break;
		}
		sourceCollections.glslSources.add("fragment") << glu::FragmentSource(src.str());
	}
}